

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::INIError::~INIError(INIError *this)

{
  INIError *this_local;
  
  ~INIError(this);
  operator_delete(this);
  return;
}

Assistant:

static INIError Extras(std::string item) { return INIError("INI was not able to parse " + item); }